

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenPadding(SwiftGenerator *this,FieldDef *field,int *id)

{
  int t;
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (field->padding != 0) {
    uVar1 = 0;
    while( true ) {
      if ((int)uVar1 == 4) break;
      if ((field->padding >> (uVar1 & 0x3f) & 1) != 0) {
        t = *id;
        *id = t + 1;
        NumToString<int>(&local_d0,t);
        std::operator+(&local_70,"private let padding",&local_d0);
        std::operator+(&local_f0,&local_70,"__: UInt");
        NumToString<int>(&local_90,8 << ((byte)uVar1 & 0x1f));
        std::operator+(&local_b0,&local_f0,&local_90);
        std::operator+(&local_50,&local_b0," = 0");
        CodeWriter::operator+=(&this->code_,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      uVar1 = (ulong)((int)uVar1 + 1);
    }
    if (0xf < field->padding) {
      __assert_fail("!(field.padding & ~0xF)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_swift.cpp"
                    ,0x6eb,
                    "void flatbuffers::swift::SwiftGenerator::GenPadding(const FieldDef &, int *)");
    }
  }
  return;
}

Assistant:

inline void GenPadding(const FieldDef &field, int *id) {
    if (field.padding) {
      for (int i = 0; i < 4; i++) {
        if (static_cast<int>(field.padding) & (1 << i)) {
          const auto bits = (1 << i) * 8;
          code_ += "private let padding" + NumToString((*id)++) + "__: UInt" +
                   NumToString(bits) + " = 0";
        }
      }
      FLATBUFFERS_ASSERT(!(field.padding & ~0xF));
    }
  }